

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O3

void __thiscall CsSignal::SlotBase::~SlotBase(SlotBase *this)

{
  SharedList<const_SignalBase_*> *this_00;
  atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
  *paVar1;
  rcu_write_guard *this_01;
  __pointer_type pzVar2;
  iterator iter;
  __pointer_type pnVar4;
  bool bVar5;
  write_handle senderListHandle;
  read_handle receiverListHandle;
  write_handle local_70;
  read_handle local_50;
  __pointer_type pzVar3;
  
  this->_vptr_SlotBase = (_func_int **)&PTR__SlotBase_00107d68;
  this_00 = &this->m_possibleSenders;
  local_50.m_accessed = false;
  local_50.m_ptr = &this_00->m_obj;
  local_50.m_guard.m_list = &this_00->m_obj;
  local_50.m_guard.m_zombie = (zombie_list_node *)operator_new(0x18);
  ((local_50.m_guard.m_zombie)->next)._M_b._M_p = (__pointer_type)0x0;
  ((local_50.m_guard.m_zombie)->owner)._M_b._M_p = &local_50.m_guard;
  (local_50.m_guard.m_zombie)->zombie_node = (node *)0x0;
  pzVar3 = (this->m_possibleSenders).m_obj.m_zombie_head._M_b._M_p;
  ((local_50.m_guard.m_zombie)->next)._M_b._M_p = pzVar3;
  while( true ) {
    paVar1 = &(this->m_possibleSenders).m_obj.m_zombie_head;
    LOCK();
    pzVar2 = (paVar1->_M_b)._M_p;
    bVar5 = pzVar3 == pzVar2;
    if (bVar5) {
      (paVar1->_M_b)._M_p = local_50.m_guard.m_zombie;
      pzVar2 = pzVar3;
    }
    UNLOCK();
    if (bVar5) break;
    ((local_50.m_guard.m_zombie)->next)._M_b._M_p = pzVar2;
    pzVar3 = pzVar2;
  }
  local_50.m_accessed = true;
  pnVar4 = (((rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              *)&(local_50.m_ptr)->m_head)->m_head)._M_b._M_p;
  if (pnVar4 == (__pointer_type)0x0) {
LAB_001054ea:
    libguarded::
    rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
    ::read_handle::~read_handle(&local_50);
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::~rcu_list(&this_00->m_obj);
    return;
  }
  this_01 = &local_70.m_guard;
LAB_0010545e:
  local_70.m_ptr = &(pnVar4->data->m_connectList).m_obj;
  local_70.m_accessed = false;
  libguarded::
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::rcu_guard::rcu_write_lock(this_01,local_70.m_ptr);
  local_70.m_accessed = true;
  iter.m_current = (node *)local_70.m_ptr;
  do {
    iter.m_current = ((iter.m_current)->next)._M_b._M_p;
    while( true ) {
      if (local_70.m_accessed == false) {
        libguarded::
        rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
        ::rcu_guard::rcu_write_lock(this_01,local_70.m_ptr);
        local_70.m_accessed = true;
      }
      if (iter.m_current == (node *)0x0) {
        libguarded::
        rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
        ::write_handle::~write_handle(&local_70);
        pnVar4 = (pnVar4->next)._M_b._M_p;
        if (pnVar4 != (__pointer_type)0x0) goto LAB_0010545e;
        goto LAB_001054ea;
      }
      if (((iter.m_current)->data).receiver != this) break;
      if (local_70.m_accessed == false) {
        libguarded::
        rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
        ::rcu_guard::rcu_write_lock(this_01,local_70.m_ptr);
        local_70.m_accessed = true;
      }
      iter = libguarded::
             rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
             ::erase(local_70.m_ptr,iter.m_current);
    }
  } while( true );
}

Assistant:

CsSignal::SlotBase::~SlotBase()
{
   try {
      // clean up possible sender connections
      auto receiverListHandle = m_possibleSenders.lock_read();

      for (auto &sender : *receiverListHandle) {
         auto senderListHandle = sender->m_connectList.lock_write();

         auto iter = senderListHandle->begin();

         while (iter != senderListHandle->end())   {

            if (iter->receiver == this) {
               iter = senderListHandle->erase(iter);
            } else {
               ++iter;
            }
         }
      }

   } catch (...) {
     // least of the worst options
     std::terminate();
   }
}